

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# muxedit.c
# Opt level: O1

WebPMuxError SetAlphaAndImageChunks(WebPData *bitstream,int copy_data,WebPMuxImage *wpi)

{
  WebPChunk *pWVar1;
  bool bVar2;
  int iVar3;
  WebPMuxError WVar4;
  WebPMux *mux;
  long lVar5;
  bool bVar6;
  WebPData image;
  WebPData alpha;
  WebPData local_48;
  WebPData local_38;
  
  local_38.bytes = (uint8_t *)0x0;
  local_38.size = 0;
  if ((bitstream->size < 4) || (*(int *)bitstream->bytes != 0x46464952)) {
    local_48.bytes = bitstream->bytes;
    local_48.size = bitstream->size;
  }
  else {
    bVar2 = false;
    mux = WebPMuxCreateInternal(bitstream,0,0x108);
    if (mux == (WebPMux *)0x0) {
      WVar4 = WEBP_MUX_BAD_DATA;
      bVar6 = true;
      goto LAB_001058e4;
    }
    pWVar1 = mux->images_->img_;
    local_48.bytes = (pWVar1->data_).bytes;
    local_48.size = (pWVar1->data_).size;
    pWVar1 = mux->images_->alpha_;
    if (pWVar1 != (WebPChunk *)0x0) {
      local_38.bytes = (pWVar1->data_).bytes;
      local_38.size = (pWVar1->data_).size;
    }
    WebPMuxDelete(mux);
  }
  iVar3 = VP8LCheckSignature(local_48.bytes,local_48.size);
  bVar6 = iVar3 == 0;
  WVar4 = WEBP_MUX_OK;
  bVar2 = true;
LAB_001058e4:
  lVar5 = 0x48;
  if (bVar6) {
    lVar5 = 0x3c;
  }
  if (bVar2) {
    if ((local_38.bytes != (uint8_t *)0x0) &&
       (WVar4 = AddDataToChunkList(&local_38,copy_data,0x48504c41,&wpi->alpha_),
       WVar4 != WEBP_MUX_OK)) {
      return WVar4;
    }
    WVar4 = AddDataToChunkList(&local_48,copy_data,*(uint32_t *)((long)&kChunks[0].tag + lVar5),
                               &wpi->img_);
    if (WVar4 == WEBP_MUX_OK) {
      iVar3 = MuxImageFinalize(wpi);
      WVar4 = -(uint)(iVar3 == 0) | WEBP_MUX_OK;
    }
  }
  return WVar4;
}

Assistant:

static WebPMuxError SetAlphaAndImageChunks(
    const WebPData* const bitstream, int copy_data, WebPMuxImage* const wpi) {
  int is_lossless = 0;
  WebPData image, alpha;
  WebPMuxError err = GetImageData(bitstream, &image, &alpha, &is_lossless);
  const int image_tag =
      is_lossless ? kChunks[IDX_VP8L].tag : kChunks[IDX_VP8].tag;
  if (err != WEBP_MUX_OK) return err;
  if (alpha.bytes != NULL) {
    err = AddDataToChunkList(&alpha, copy_data, kChunks[IDX_ALPHA].tag,
                             &wpi->alpha_);
    if (err != WEBP_MUX_OK) return err;
  }
  err = AddDataToChunkList(&image, copy_data, image_tag, &wpi->img_);
  if (err != WEBP_MUX_OK) return err;
  return MuxImageFinalize(wpi) ? WEBP_MUX_OK : WEBP_MUX_INVALID_ARGUMENT;
}